

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O1

int __thiscall AGSSock::Pool::remove(Pool *this,char *__filename)

{
  int iVar1;
  size_type sVar2;
  __sighandler_t __handler;
  char *local_20;
  
  iVar1 = (int)&local_20;
  local_20 = __filename;
  pthread_mutex_lock((pthread_mutex_t *)&this->guard_);
  sVar2 = std::
          _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)this);
  if (sVar2 != 0) {
    AGSSockAPI::Beacon::signal(&this->beacon_,iVar1,__handler);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->guard_);
  return iVar1;
}

Assistant:

void Pool::remove(Socket *sock)
{
	Mutex::Lock lock(guard_);

	if (sockets_.erase(sock))
		beacon_.signal();

	// Signalling might not be necessary for windows: closing sockets might
	// already trigger select.
}